

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O3

char * waterbody_name(xchar x,xchar y)

{
  byte bVar1;
  boolean bVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  bool bVar6;
  
  if (0x14 < (byte)y || 0x4e < (byte)(x - 1U)) {
    return "drink";
  }
  bVar1 = level->locations[(byte)x][(byte)y].typ;
  bVar2 = is_lava(level,(uint)(byte)x,(uint)(byte)y);
  if (bVar2 != '\0') {
    return "lava";
  }
  if (bVar1 == 0x22) {
    return "ice";
  }
  uVar5 = (uint)bVar1;
  if (bVar1 == 0x14) {
    bVar6 = true;
    if ((*(uint *)&level->locations[(byte)x][(byte)y].field_0x6 & 0x1c0) == 0x80) {
      return "ice";
    }
  }
  else {
    bVar6 = (bVar1 & 0xfd) != 0x11;
    if ((bVar1 < 0x24) && ((0x8000a0000U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
      if ((bVar1 & 0xfd) != 0x11) goto LAB_001e0aff;
      goto LAB_001e0aad;
    }
  }
  bVar2 = on_level(&u.uz,&dungeon_topology.d_medusa_level);
  if ((((bVar2 == '\0') && (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 == '\0'))
      && (bVar2 = on_level(&u.uz,&dungeon_topology.d_juiblex_level), bVar2 == '\0')) ||
     ((uVar5 == 0x14 && ((*(ushort *)&level->locations[(byte)x][(byte)y].field_0x6 & 0x1c0) == 0))))
  {
    return "moat";
  }
  if (bVar6) {
LAB_001e0aff:
    bVar2 = on_level(&u.uz,&dungeon_topology.d_juiblex_level);
    if (bVar2 != '\0') {
      return "swamp";
    }
    if (bVar1 == 0x23) {
      return "swamp";
    }
    if (uVar5 != 0x11) {
      return "water";
    }
    return "pool of water";
  }
LAB_001e0aad:
  pcVar4 = "water";
  if (uVar5 == 0x11) {
    pcVar4 = "pool of water";
  }
  pcVar3 = "swamp";
  if (bVar1 != 0x23) {
    pcVar3 = pcVar4;
  }
  return pcVar3;
}

Assistant:

const char *waterbody_name(xchar x, xchar y)
{
	struct rm *loc;
	schar ltyp;

	if (!isok(x,y))
		return "drink";		/* should never happen */
	loc = &level->locations[x][y];
	ltyp = loc->typ;

	if (is_lava(level, x,y))
		return "lava";
	else if (ltyp == ICE ||
		 (ltyp == DRAWBRIDGE_UP &&
		  (level->locations[x][y].drawbridgemask & DB_UNDER) == DB_ICE))
		return "ice";
	else if ((ltyp != POOL && ltyp != WATER && ltyp != BOG &&
	  !Is_medusa_level(&u.uz) && !Is_waterlevel(&u.uz) && !Is_juiblex_level(&u.uz)) ||
	   (ltyp == DRAWBRIDGE_UP && (level->locations[x][y].drawbridgemask & DB_UNDER) == DB_MOAT))
		return "moat";
	else if ((ltyp != POOL && ltyp != WATER && Is_juiblex_level(&u.uz)) ||
		 ltyp == BOG)
		return "swamp";
	else if (ltyp == POOL)
		return "pool of water";
	else return "water";
}